

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

DECODER_MODEL_STATUS
av1_decoder_model_try_smooth_buf(AV1_COMP *cpi,size_t coded_bits,DECODER_MODEL *decoder_model)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  int qsize;
  int qhead;
  double total_interval;
  DFG_INTERVAL_QUEUE *queue;
  double last_bit_arrival_time;
  double first_bit_arrival_time;
  double latest_arrival_time;
  double buffer_delay;
  double removal_time;
  int num_decoded_frame;
  size_t cur_coded_bits;
  int show_existing_frame;
  AV1_COMMON *cm;
  DECODER_MODEL_STATUS status;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined8 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  double local_80;
  DECODER_MODEL_STATUS local_1;
  
  if ((in_RDX == (char *)0x0) || (*in_RDX != '\0')) {
    local_1 = '\0';
  }
  else {
    lVar2 = *(long *)(in_RDX + 0x780) + in_RSI;
    if (*(int *)(in_RDI + 0x3c168) == 0) {
      dVar5 = get_removal_time(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                               (FRAME_BUFFER *)
                               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                               1.20249402377186e-317);
      if (0.0 <= dVar5) {
        dVar6 = dVar5 - (double)(*(int *)(in_RDX + 4) + *(int *)(in_RDX + 8)) / 90000.0;
        if (dVar6 < *(double *)(in_RDX + 0x778)) {
          dVar6 = *(double *)(in_RDX + 0x778);
        }
        auVar8._8_4_ = (int)((ulong)lVar2 >> 0x20);
        auVar8._0_8_ = lVar2;
        auVar8._12_4_ = 0x45300000;
        dVar7 = dVar6 + ((auVar8._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) /
                        *(double *)(in_RDX + 0x38);
        if ((dVar7 <= dVar5) || ((in_RDX[2] & 1U) != 0)) {
          piVar3 = (int *)(in_RDX + 0x160);
          local_80 = *(double *)(in_RDX + 0x168);
          iVar4 = *piVar3;
          for (iVar1 = *(int *)(in_RDX + 0x164);
              *(double *)(piVar3 + (long)iVar4 * 6 + 8) <= dVar7 && 0 < iVar1; iVar1 = iVar1 + -1) {
            if (1.0 < (*(double *)(piVar3 + (long)iVar4 * 6 + 8) - dVar6) + local_80) {
              return '\x06';
            }
            local_80 = local_80 -
                       (*(double *)(piVar3 + (long)iVar4 * 6 + 6) -
                       *(double *)(in_RDX + (long)iVar4 * 0x18 + 0x170));
            iVar4 = (iVar4 + 1) % 0x40;
          }
          if ((dVar7 - dVar6) + local_80 <= 1.0) {
            local_1 = '\0';
          }
          else {
            local_1 = '\x06';
          }
        }
        else {
          local_1 = '\x05';
        }
      }
      else {
        local_1 = '\x02';
      }
    }
    else {
      local_1 = '\0';
    }
  }
  return local_1;
}

Assistant:

DECODER_MODEL_STATUS av1_decoder_model_try_smooth_buf(
    const AV1_COMP *const cpi, size_t coded_bits,
    const DECODER_MODEL *const decoder_model) {
  DECODER_MODEL_STATUS status = DECODER_MODEL_OK;

  if (!decoder_model || decoder_model->status != DECODER_MODEL_OK) {
    return status;
  }

  const AV1_COMMON *const cm = &cpi->common;
  const int show_existing_frame = cm->show_existing_frame;

  size_t cur_coded_bits = decoder_model->coded_bits + coded_bits;
  int num_decoded_frame = decoder_model->num_decoded_frame;
  if (!show_existing_frame) ++num_decoded_frame;

  if (show_existing_frame) {
    return status;
  } else {
    const double removal_time = get_removal_time(
        decoder_model->mode, num_decoded_frame,
        decoder_model->decoder_buffer_delay, decoder_model->frame_buffer_pool,
        decoder_model->current_time);
    if (removal_time < 0.0) {
      status = DECODE_FRAME_BUF_UNAVAILABLE;
      return status;
    }

    // A frame with show_existing_frame being false indicates the end of a DFG.
    // Update the bits arrival time of this DFG.
    const double buffer_delay = (decoder_model->encoder_buffer_delay +
                                 decoder_model->decoder_buffer_delay) /
                                90000.0;
    const double latest_arrival_time = removal_time - buffer_delay;
    const double first_bit_arrival_time =
        AOMMAX(decoder_model->last_bit_arrival_time, latest_arrival_time);
    const double last_bit_arrival_time =
        first_bit_arrival_time +
        (double)cur_coded_bits / decoder_model->bit_rate;
    // Smoothing buffer underflows if the last bit arrives after the removal
    // time.
    if (last_bit_arrival_time > removal_time &&
        !decoder_model->is_low_delay_mode) {
      status = SMOOTHING_BUFFER_UNDERFLOW;
      return status;
    }

    // Check if the smoothing buffer overflows.
    const DFG_INTERVAL_QUEUE *const queue = &decoder_model->dfg_interval_queue;
    if (queue->size >= DFG_INTERVAL_QUEUE_SIZE) {
      assert(0);
    }

    double total_interval = queue->total_interval;
    int qhead = queue->head;
    int qsize = queue->size;
    // Remove the DFGs with removal time earlier than last_bit_arrival_time.
    while (queue->buf[qhead].removal_time <= last_bit_arrival_time &&
           qsize > 0) {
      if (queue->buf[qhead].removal_time - first_bit_arrival_time +
              total_interval >
          1.0) {
        status = SMOOTHING_BUFFER_OVERFLOW;
        return status;
      }
      total_interval -= queue->buf[qhead].last_bit_arrival_time -
                        queue->buf[qhead].first_bit_arrival_time;
      qhead = (qhead + 1) % DFG_INTERVAL_QUEUE_SIZE;
      --qsize;
    }
    total_interval += last_bit_arrival_time - first_bit_arrival_time;
    // The smoothing buffer can hold at most "bit_rate" bits, which is
    // equivalent to 1 second of total interval.
    if (total_interval > 1.0) {
      status = SMOOTHING_BUFFER_OVERFLOW;
      return status;
    }

    return status;
  }
}